

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask17_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = in[1];
  vpmovsxbd_avx(ZEXT416(0x241c140c));
  uVar2 = in[0xd];
  uVar3 = in[0xf];
  *out = uVar1 << 0x11 | *in;
  uVar4 = in[0xb];
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar2));
  auVar8 = vpmovsxbd_avx(ZEXT416(0x2010004));
  auVar8 = vpermi2d_avx512vl(auVar8,auVar7,ZEXT416(uVar1));
  auVar6 = vpsrlvd_avx2(auVar8,_DAT_001a0700);
  vpmovsxbd_avx(ZEXT416(0x20181008));
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar2));
  auVar8 = vpsllvd_avx2(auVar8,_DAT_001a0660);
  auVar9 = vpsllvd_avx2(auVar7,_DAT_001a5040);
  auVar9 = vpternlogd_avx512vl(auVar9,auVar8,auVar6,0xfe);
  uVar1 = in[10];
  auVar8 = vpshufd_avx(auVar7,0xff);
  *(undefined1 (*) [16])(out + 1) = auVar9;
  auVar8 = vpinsrd_avx(auVar8,uVar4,1);
  auVar6 = vpsrlvd_avx2(auVar8,_DAT_001a3140);
  uVar5 = in[0xe];
  auVar8 = vpinsrd_avx(ZEXT416(uVar4),uVar2,1);
  auVar9 = vpsllvd_avx2(auVar8,_DAT_001ad6b0);
  auVar8 = vpinsrd_avx(ZEXT416(uVar1),in[0xc],1);
  auVar8 = vpsllvd_avx2(auVar8,_DAT_001a3150);
  auVar8 = vpternlogd_avx512vl(auVar9,auVar8,auVar6,0xfe);
  *(long *)(out + 5) = auVar8._0_8_;
  out[7] = uVar3 << 0x1f | uVar5 << 0xe | uVar2 >> 3;
  out[8] = uVar3 >> 1;
  return out + 9;
}

Assistant:

uint32_t *__fastpackwithoutmask17_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (17 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (17 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (17 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (17 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (17 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (17 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (17 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (17 - 16);
  ++in;

  return out + 1;
}